

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuItemStaticTextSwitchable::FOptionMenuItemStaticTextSwitchable
          (FOptionMenuItemStaticTextSwitchable *this,char *label,char *label2,FName *action,
          EColorRange cr)

{
  FName local_30;
  EColorRange local_2c;
  FName *pFStack_28;
  EColorRange cr_local;
  FName *action_local;
  char *label2_local;
  char *label_local;
  FOptionMenuItemStaticTextSwitchable *this_local;
  
  local_2c = cr;
  pFStack_28 = action;
  action_local = (FName *)label2;
  label2_local = label;
  label_local = (char *)this;
  FName::FName(&local_30,action);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_30,true);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItemStaticTextSwitchable_009ee0c0;
  FString::FString(&this->mAltText);
  *(EColorRange *)&(this->super_FOptionMenuItem).field_0x24 = local_2c;
  FString::operator=(&this->mAltText,(char *)action_local);
  this->mCurrent = 0;
  return;
}

Assistant:

FOptionMenuItemStaticTextSwitchable(const char *label, const char *label2, FName action, EColorRange cr)
		: FOptionMenuItem(label, action, true)
	{
		mColor = cr;
		mAltText = label2;
		mCurrent = 0;
	}